

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O0

bool __thiscall
MultiSigningProvider::GetTaprootSpendData
          (MultiSigningProvider *this,XOnlyPubKey *output_key,TaprootSpendData *spenddata)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  pointer pSVar4;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_FS_OFFSET;
  unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_> *provider;
  vector<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>,_std::allocator<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_>_>
  *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  __normal_iterator<const_std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_*,_std::vector<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>,_std::allocator<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_>_>_>
  *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  __normal_iterator<const_std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_*,_std::vector<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>,_std::allocator<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_>_>_>
  *in_stack_ffffffffffffffb8;
  bool local_19;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>,_std::allocator<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_>_>
  ::begin((vector<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>,_std::allocator<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_>_>
           *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  std::
  vector<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>,_std::allocator<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_>_>
  ::end((vector<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>,_std::allocator<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_>_>
         *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  do {
    bVar2 = __gnu_cxx::
            operator==<const_std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_*,_std::vector<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>,_std::allocator<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_>_>_>
                      (in_stack_ffffffffffffffb8,
                       (__normal_iterator<const_std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_*,_std::vector<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>,_std::allocator<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_>_>_>
                        *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_19 = false;
LAB_00329514:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return local_19;
      }
      __stack_chk_fail();
    }
    in_stack_ffffffffffffffb8 =
         (__normal_iterator<const_std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_*,_std::vector<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>,_std::allocator<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_>_>_>
          *)__gnu_cxx::
            __normal_iterator<const_std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_*,_std::vector<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>,_std::allocator<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_>_>_>
            ::operator*(in_stack_ffffffffffffffa8);
    pSVar4 = std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>::operator->
                       ((unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_> *)
                        in_stack_ffffffffffffffa8);
    uVar3 = (*pSVar4->_vptr_SigningProvider[8])(pSVar4,in_RSI,in_RDX);
    if ((uVar3 & 1) != 0) {
      local_19 = true;
      goto LAB_00329514;
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_*,_std::vector<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>,_std::allocator<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_>_>_>
    ::operator++(in_stack_ffffffffffffffa8);
  } while( true );
}

Assistant:

bool MultiSigningProvider::GetTaprootSpendData(const XOnlyPubKey& output_key, TaprootSpendData& spenddata) const
{
    for (const auto& provider: m_providers) {
        if (provider->GetTaprootSpendData(output_key, spenddata)) return true;
    }
    return false;
}